

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall embree::FileName::ext_abi_cxx11_(FileName *this)

{
  ulong in_RSI;
  string *in_RDI;
  size_t pos;
  allocator local_19;
  long local_18;
  
  local_18 = std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if (local_18 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string FileName::ext() const {
    size_t pos = filename.find_last_of('.');
    if (pos == std::string::npos) return "";
    return filename.substr(pos+1);
  }